

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CholeskyDecomposition.hpp
# Opt level: O0

void OpenMD::CholeskyDecomposition<OpenMD::SquareMatrix<double,6>>
               (SquareMatrix<double,_6> *A,SquareMatrix<double,_6> *L)

{
  int iVar1;
  undefined4 extraout_var;
  double *pdVar2;
  RectMatrix<double,_6U,_6U> *in_RSI;
  RectMatrix<double,_6U,_6U> *in_RDI;
  RectMatrix<double,_6U,_6U> *pRVar3;
  double dVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  uint k_1;
  uint i;
  RealType s;
  uint k;
  RealType d;
  uint j;
  RealType eps;
  bool isspd;
  uint n;
  double local_b8;
  bool local_a9;
  SquareMatrix<double,_6> *in_stack_ffffffffffffff58;
  bool local_91;
  uint local_78;
  uint local_74;
  double local_70;
  uint local_64;
  double local_60;
  uint local_54;
  Vector<double,_6U> local_50;
  double local_20;
  bool local_15;
  uint local_14;
  RectMatrix<double,_6U,_6U> *local_10;
  RectMatrix<double,_6U,_6U> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_14 = RectMatrix<double,_6U,_6U>::getNRow(in_RDI);
  local_15 = true;
  iVar1 = (int)local_8;
  SquareMatrix<double,_6>::diagonals(in_stack_ffffffffffffff58);
  iVar1 = Vector<double,_6U>::abs(&local_50,iVar1);
  dVar4 = Vector<double,_6U>::max((Vector<double,_6U> *)CONCAT44(extraout_var,iVar1));
  dVar5 = std::numeric_limits<double>::epsilon();
  local_20 = (dVar4 * dVar5) / 100.0;
  for (local_54 = 0; local_54 < local_14; local_54 = local_54 + 1) {
    local_60 = 0.0;
    for (local_64 = 0; local_64 < local_54; local_64 = local_64 + 1) {
      local_70 = 0.0;
      for (local_74 = 0; local_74 < local_64; local_74 = local_74 + 1) {
        pdVar2 = RectMatrix<double,_6U,_6U>::operator()(local_10,local_64,local_74);
        dVar4 = *pdVar2;
        pdVar2 = RectMatrix<double,_6U,_6U>::operator()(local_10,local_54,local_74);
        local_70 = dVar4 * *pdVar2 + local_70;
      }
      pRVar3 = local_10;
      RectMatrix<double,_6U,_6U>::operator()(local_10,local_64,local_64);
      std::abs((int)pRVar3);
      if (extraout_XMM0_Qa <= local_20) {
        pdVar2 = RectMatrix<double,_6U,_6U>::operator()(local_8,local_54,local_64);
        local_70 = *pdVar2 - local_70;
        local_15 = false;
      }
      else {
        pdVar2 = RectMatrix<double,_6U,_6U>::operator()(local_8,local_54,local_64);
        dVar4 = *pdVar2;
        pdVar2 = RectMatrix<double,_6U,_6U>::operator()(local_10,local_64,local_64);
        local_70 = (dVar4 - local_70) / *pdVar2;
      }
      pdVar2 = RectMatrix<double,_6U,_6U>::operator()(local_10,local_54,local_64);
      *pdVar2 = local_70;
      local_60 = local_70 * local_70 + local_60;
      local_91 = false;
      if ((local_15 & 1U) != 0) {
        RectMatrix<double,_6U,_6U>::operator()(local_8,local_64,local_54);
        pRVar3 = local_8;
        RectMatrix<double,_6U,_6U>::operator()(local_8,local_54,local_64);
        std::abs((int)pRVar3);
        local_91 = extraout_XMM0_Qa_00 < local_20;
      }
      local_15 = local_91;
    }
    pdVar2 = RectMatrix<double,_6U,_6U>::operator()(local_8,local_54,local_54);
    local_b8 = *pdVar2 - local_60;
    local_a9 = (local_15 & 1U) != 0 && local_20 < local_b8;
    local_15 = local_a9;
    if (local_b8 <= 0.0) {
      local_b8 = 0.0;
    }
    dVar4 = sqrt(local_b8);
    pdVar2 = RectMatrix<double,_6U,_6U>::operator()(local_10,local_54,local_54);
    *pdVar2 = dVar4;
    local_78 = local_54;
    while (local_78 = local_78 + 1, local_78 < local_14) {
      pdVar2 = RectMatrix<double,_6U,_6U>::operator()(local_10,local_54,local_78);
      *pdVar2 = 0.0;
    }
  }
  return;
}

Assistant:

void CholeskyDecomposition(MatrixType& A, MatrixType& L) {
    unsigned int n = A.getNRow();
    assert(n == A.getNCol() && n == L.getNRow() && n == L.getNCol());

    bool isspd(true);
    RealType eps =
        A.diagonals().abs().max() * (numeric_limits<RealType>::epsilon()) / 100;

    for (unsigned int j = 0; j < n; j++) {
      RealType d(0.0);
      for (unsigned int k = 0; k < j; k++) {
        RealType s(0.0);

        for (unsigned int i = 0; i < k; i++) {
          s += L(k, i) * L(j, i);
        }

        // if L(k,k) != 0
        if (std::abs(L(k, k)) > eps) {
          s = (A(j, k) - s) / L(k, k);
        } else {
          s     = (A(j, k) - s);
          isspd = false;
        }
        L(j, k) = s;
        d       = d + s * s;

        // this is approximately doing: isspd = isspd && ( A(k,j) == A(j,k) )
        isspd = isspd && (abs(A(k, j) - A(j, k)) < eps);
      }
      d       = A(j, j) - d;
      isspd   = isspd && (d > eps);
      L(j, j) = sqrt(d > 0.0 ? d : 0.0);
      for (unsigned int k = j + 1; k < n; k++) {
        L(j, k) = 0.0;
      }
    }
  }